

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O3

TRef lj_opt_fwd_uload(jit_State *J)

{
  ushort uVar1;
  ushort uVar2;
  short sVar3;
  short sVar4;
  IRIns *pIVar5;
  uint uVar6;
  TRef TVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  ushort uVar12;
  
  uVar1 = (J->fold).ins.field_0.op1;
  uVar9 = (ulong)uVar1;
  pIVar5 = (J->cur).ir;
  uVar2 = J->chain[0x4c];
  uVar10 = 0x8000;
  if (0x8000 < uVar2) {
    do {
      uVar8 = (ulong)uVar2;
      uVar11 = (ulong)pIVar5[uVar8].field_0.op1;
      if (*(char *)((long)pIVar5 + uVar9 * 8 + 5) == *(char *)((long)pIVar5 + uVar11 * 8 + 5)) {
        sVar3 = *(short *)((long)pIVar5 + uVar9 * 8 + 2);
        sVar4 = *(short *)((long)pIVar5 + uVar11 * 8 + 2);
        if (pIVar5[uVar9].field_0.op1 == pIVar5[uVar11].field_0.op1) {
          if (sVar3 == sVar4) {
            return (uint)*(ushort *)((long)pIVar5 + uVar8 * 8 + 2);
          }
        }
        else if ((char)sVar4 == (char)sVar3) {
          uVar10 = (uint)uVar2;
          break;
        }
      }
      uVar2 = *(ushort *)((long)pIVar5 + uVar8 * 8 + 6);
    } while (0x8000 < uVar2);
  }
  uVar2 = J->chain[0x44];
  uVar8 = (ulong)uVar2;
  uVar6 = (uint)uVar2;
  if (uVar10 < uVar6) {
    uVar12 = pIVar5[uVar6].field_0.op1;
    if (uVar12 != uVar1) {
      uVar11 = (ulong)uVar6;
      do {
        if ((pIVar5[uVar12].field_1.op12 == pIVar5[uVar9].field_1.op12) &&
           (*(char *)((long)pIVar5 + (ulong)uVar12 * 8 + 5) ==
            *(char *)((long)pIVar5 + uVar9 * 8 + 5))) {
          return (TRef)uVar8;
        }
        uVar2 = *(ushort *)((long)pIVar5 + uVar11 * 8 + 6);
        uVar8 = (ulong)uVar2;
        if (uVar2 <= uVar10) goto LAB_00157237;
        uVar12 = pIVar5[uVar8].field_0.op1;
        uVar11 = uVar8;
      } while (uVar12 != uVar1);
    }
    return (uint)uVar2;
  }
LAB_00157237:
  TVar7 = lj_ir_emit(J);
  return TVar7;
}

Assistant:

TRef LJ_FASTCALL lj_opt_fwd_uload(jit_State *J)
{
  IRRef uref = fins->op1;
  IRRef lim = REF_BASE;  /* Search limit. */
  IRIns *xr = IR(uref);
  IRRef ref;

  /* Search for conflicting stores. */
  ref = J->chain[IR_USTORE];
  while (ref > lim) {
    IRIns *store = IR(ref);
    switch (aa_uref(xr, IR(store->op1))) {
    case ALIAS_NO:   break;  /* Continue searching. */
    case ALIAS_MAY:  lim = ref; goto cselim;  /* Limit search for load. */
    case ALIAS_MUST: return store->op2;  /* Store forwarding. */
    }
    ref = store->prev;
  }

cselim:
  /* Try to find a matching load. Below the conflicting store, if any. */
  ref = J->chain[IR_ULOAD];
  while (ref > lim) {
    IRIns *ir = IR(ref);
    if (ir->op1 == uref ||
	(IR(ir->op1)->op12 == IR(uref)->op12 && IR(ir->op1)->o == IR(uref)->o))
      return ref;  /* Match for identical or equal UREFx (non-CSEable UREFO). */
    ref = ir->prev;
  }
  return lj_ir_emit(J);
}